

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue JS_AtomIsNumericIndex1(JSContext *ctx,JSAtom atom)

{
  int iVar1;
  JSValueUnion ctx_00;
  uint uVar2;
  int iVar3;
  JSValueUnion p1;
  uint uVar6;
  list_head **pplVar7;
  byte bVar8;
  ushort uVar9;
  JSRefCountHeader *p_1;
  JSRefCountHeader *p;
  JSRefCountHeader *p_2;
  JSValue JVar10;
  JSValue JVar11;
  ulong uVar4;
  JSValueUnion JVar5;
  
  if ((int)atom < 0) {
    return (JSValue)ZEXT416(atom & 0x7fffffff);
  }
  ctx_00 = (JSValueUnion)((JSValueUnion *)(ctx->rt->atom_array + atom))->ptr;
  if ((uint)((ulong)*(undefined8 *)((long)ctx_00.ptr + 4) >> 0x3e) == 1) {
    uVar6 = (uint)*(undefined8 *)((long)ctx_00.ptr + 4);
    uVar2 = uVar6 & 0x7fffffff;
    uVar4 = (ulong)uVar2;
    if ((int)uVar6 < 0) {
      if (uVar4 == 0) goto LAB_0011fe2c;
      uVar9 = *(ushort *)((long)ctx_00.ptr + 0x10);
      if (uVar9 == 0x2d) {
        uVar9 = *(ushort *)((long)ctx_00.ptr + 0x12);
        if (uVar2 == 2 && uVar9 == 0x30) goto LAB_0011fc98;
        pplVar7 = (list_head **)((long)ctx_00.ptr + 0x12);
      }
      else {
        pplVar7 = (list_head **)((long)ctx_00.ptr + 0x10);
      }
      if (uVar9 - 0x3a < 0xfffffff6) {
        if (uVar9 != 0x49) {
          return (JSValue)(ZEXT816(3) << 0x40);
        }
        if ((long)ctx_00.ptr + ((uVar4 * 2 + 0x10) - (long)pplVar7) != 0x10) {
          return (JSValue)(ZEXT816(3) << 0x40);
        }
        if (pplVar7[1] != (list_head *)0x7900740069006e ||
            *(long *)((long)pplVar7 + 2) != 0x6e00690066006e) goto LAB_0011fe2c;
      }
    }
    else {
      if (uVar4 == 0) goto LAB_0011fe2c;
      bVar8 = *(byte *)((long)ctx_00.ptr + 0x10);
      if (bVar8 == 0x2d) {
        bVar8 = *(byte *)((long)ctx_00.ptr + 0x11);
        if (uVar2 == 2 && bVar8 == 0x30) {
LAB_0011fc98:
          JVar10.tag = 7;
          JVar10.u.float64 = -0.0;
          return JVar10;
        }
        pplVar7 = (list_head **)((long)ctx_00.ptr + 0x11);
      }
      else {
        pplVar7 = (list_head **)((long)ctx_00.ptr + 0x10);
      }
      if (bVar8 - 0x3a < 0xfffffff6) {
        if (bVar8 != 0x49) {
          return (JSValue)(ZEXT816(3) << 0x40);
        }
        if ((long)ctx_00.ptr + ((uVar4 + 0x10) - (long)pplVar7) != 8) {
          return (JSValue)(ZEXT816(3) << 0x40);
        }
        if (*(int *)((long)pplVar7 + 4) != 0x7974696e || *(int *)((long)pplVar7 + 1) != 0x6e69666e)
        goto LAB_0011fe2c;
      }
    }
    *(int *)ctx_00.ptr = *ctx_00.ptr + 1;
    JVar11.tag = -7;
    JVar11.u.ptr = ctx_00.ptr;
    JVar10 = JS_ToNumberHintFree(ctx,JVar11,(JSToNumberHintEnum)pplVar7);
    JVar5 = JVar10.u;
    uVar2 = (uint)JVar10.tag;
    if (uVar2 == 6) {
      return JVar10;
    }
    JVar11 = JS_ToStringInternal(ctx,JVar10,0);
    p1 = JVar11.u;
    if ((uint)JVar11.tag == 6) {
      if (uVar2 < 0xfffffff5) {
        return JVar11;
      }
      iVar3 = *JVar5.ptr;
      *(int *)JVar5.ptr = iVar3 + -1;
      if (1 < iVar3) {
        return JVar11;
      }
      __JS_FreeValueRT(ctx->rt,JVar10);
      return JVar11;
    }
    iVar3 = js_string_compare((JSContext *)ctx_00.ptr,(JSString *)p1.ptr,(JSString *)JVar11.tag);
    if ((0xfffffff4 < (uint)JVar11.tag) && (iVar1 = *p1.ptr, *(int *)p1.ptr = iVar1 + -1, iVar1 < 2)
       ) {
      __JS_FreeValueRT(ctx->rt,JVar11);
    }
    if (iVar3 == 0) {
      return JVar10;
    }
    if ((0xfffffff4 < uVar2) && (iVar3 = *JVar5.ptr, *(int *)JVar5.ptr = iVar3 + -1, iVar3 < 2)) {
      __JS_FreeValueRT(ctx->rt,JVar10);
    }
  }
LAB_0011fe2c:
  return (JSValue)(ZEXT816(3) << 0x40);
}

Assistant:

static JSValue JS_AtomIsNumericIndex1(JSContext *ctx, JSAtom atom)
{
    JSRuntime *rt = ctx->rt;
    JSAtomStruct *p1;
    JSString *p;
    int c, len, ret;
    JSValue num, str;

    if (__JS_AtomIsTaggedInt(atom))
        return JS_NewInt32(ctx, __JS_AtomToUInt32(atom));
    assert(atom < rt->atom_size);
    p1 = rt->atom_array[atom];
    if (p1->atom_type != JS_ATOM_TYPE_STRING)
        return JS_UNDEFINED;
    p = p1;
    len = p->len;
    if (p->is_wide_char) {
        const uint16_t *r = p->u.str16, *r_end = p->u.str16 + len;
        if (r >= r_end)
            return JS_UNDEFINED;
        c = *r;
        if (c == '-') {
            if (r >= r_end)
                return JS_UNDEFINED;
            r++;
            c = *r;
            /* -0 case is specific */
            if (c == '0' && len == 2)
                goto minus_zero;
        }
        /* XXX: should test NaN, but the tests do not check it */
        if (!is_num(c)) {
            /* XXX: String should be normalized, therefore 8-bit only */
            const uint16_t nfinity16[7] = { 'n', 'f', 'i', 'n', 'i', 't', 'y' };
            if (!(c =='I' && (r_end - r) == 8 &&
                  !memcmp(r + 1, nfinity16, sizeof(nfinity16))))
                return JS_UNDEFINED;
        }
    } else {
        const uint8_t *r = p->u.str8, *r_end = p->u.str8 + len;
        if (r >= r_end)
            return JS_UNDEFINED;
        c = *r;
        if (c == '-') {
            if (r >= r_end)
                return JS_UNDEFINED;
            r++;
            c = *r;
            /* -0 case is specific */
            if (c == '0' && len == 2) {
            minus_zero:
                return __JS_NewFloat64(ctx, -0.0);
            }
        }
        if (!is_num(c)) {
            if (!(c =='I' && (r_end - r) == 8 &&
                  !memcmp(r + 1, "nfinity", 7)))
                return JS_UNDEFINED;
        }
    }
    /* XXX: bignum: would be better to only accept integer to avoid
       relying on current floating point precision */
    /* this is ECMA CanonicalNumericIndexString primitive */
    num = JS_ToNumber(ctx, JS_MKPTR(JS_TAG_STRING, p));
    if (JS_IsException(num))
        return num;
    str = JS_ToString(ctx, num);
    if (JS_IsException(str)) {
        JS_FreeValue(ctx, num);
        return str;
    }
    ret = js_string_compare(ctx, p, JS_VALUE_GET_STRING(str));
    JS_FreeValue(ctx, str);
    if (ret == 0) {
        return num;
    } else {
        JS_FreeValue(ctx, num);
        return JS_UNDEFINED;
    }
}